

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O2

string * __thiscall
t_c_glib_generator::constant_value_with_storage
          (string *__return_storage_ptr__,t_c_glib_generator *this,string *fname,t_type *etype,
          t_const_value *value)

{
  bool bVar1;
  ostream *poVar2;
  t_c_glib_generator *this_00;
  string *this_01;
  ostringstream render;
  string sStack_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  
  this_01 = &sStack_248;
  this_00 = (t_c_glib_generator *)&stack0xfffffffffffffe58;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  bVar1 = is_numeric(this_00,etype);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe58,"    ");
    type_name_abi_cxx11_(&local_228,this,etype,false,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_228);
    poVar2 = std::operator<<(poVar2," *");
    poVar2 = std::operator<<(poVar2,(string *)fname);
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = std::operator<<(poVar2,"g_new (");
    base_type_name_abi_cxx11_(&sStack_248,this,etype);
    poVar2 = std::operator<<(poVar2,(string *)&sStack_248);
    poVar2 = std::operator<<(poVar2,", 1);");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"    *");
    poVar2 = std::operator<<(poVar2,(string *)fname);
    poVar2 = std::operator<<(poVar2," = ");
    std::__cxx11::string::string((string *)&local_1e8,(string *)fname);
    constant_value(&local_1c8,this,&local_1e8,etype,value);
    poVar2 = std::operator<<(poVar2,(string *)&local_1c8);
    poVar2 = std::operator<<(poVar2,";");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  else {
    poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe58,"    ");
    type_name_abi_cxx11_(&local_228,this,etype,false,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_228);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,(string *)fname);
    poVar2 = std::operator<<(poVar2," = ");
    std::__cxx11::string::string((string *)&local_208,(string *)fname);
    constant_value(&sStack_248,this,&local_208,etype,value);
    poVar2 = std::operator<<(poVar2,(string *)&sStack_248);
    poVar2 = std::operator<<(poVar2,";");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_248);
    this_01 = &local_208;
  }
  std::__cxx11::string::~string((string *)this_01);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe58);
  return __return_storage_ptr__;
}

Assistant:

string t_c_glib_generator::constant_value_with_storage(string fname,
                                                       t_type* etype,
                                                       t_const_value* value) {
  ostringstream render;
  if (is_numeric(etype)) {
    render << "    " << type_name(etype) << " *" << fname << " = "
           << "g_new (" << base_type_name(etype) << ", 1);" << endl
           << "    *" << fname << " = " << constant_value(fname, (t_type*)etype, value) << ";"
           << endl;
  } else {
    render << "    " << type_name(etype) << " " << fname << " = "
           << constant_value(fname, (t_type*)etype, value) << ";" << endl;
  }
  return render.str();
}